

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_ManTimeExpand(Abc_ManTime_t *p,int nSize,int fProgressive)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pVVar2 = p->vArrs;
  iVar1 = pVVar2->nSize;
  uVar9 = (ulong)iVar1;
  if (iVar1 < nSize) {
    uVar8 = nSize << (fProgressive != 0);
    uVar7 = 100;
    if (100 < (int)uVar8) {
      uVar7 = uVar8;
    }
    uVar10 = (ulong)uVar7;
    if (pVVar2->nCap < (int)uVar7) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(uVar10 * 8);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,uVar10 * 8);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = uVar7;
    }
    pVVar2->nSize = uVar7;
    if (iVar1 == 0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = *pVVar2->pArray;
    }
    if (pvVar4 == (void *)0x0) {
      pvVar4 = malloc(uVar10 * 8);
    }
    else {
      pvVar4 = realloc(pvVar4,uVar10 * 8);
    }
    lVar5 = 0;
    do {
      *(long *)((long)pVVar2->pArray + lVar5) = (long)pvVar4 + lVar5;
      lVar5 = lVar5 + 8;
    } while (uVar10 * 8 - lVar5 != 0);
    if (iVar1 < (int)uVar7) {
      ppvVar3 = pVVar2->pArray;
      uVar6 = uVar9;
      do {
        *(undefined8 *)ppvVar3[uVar6] = 0xce6e6b28ce6e6b28;
        uVar6 = uVar6 + 1;
      } while (uVar10 != uVar6);
    }
    pVVar2 = p->vReqs;
    if (pVVar2->nCap < (int)uVar7) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(uVar10 * 8);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,uVar10 * 8);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = uVar7;
    }
    pVVar2->nSize = uVar7;
    if (iVar1 == 0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = *pVVar2->pArray;
    }
    if (pvVar4 == (void *)0x0) {
      pvVar4 = malloc(uVar10 * 8);
    }
    else {
      pvVar4 = realloc(pvVar4,uVar10 * 8);
    }
    lVar5 = 0;
    do {
      *(long *)((long)pVVar2->pArray + lVar5) = (long)pvVar4 + lVar5;
      lVar5 = lVar5 + 8;
    } while (uVar10 * 8 - lVar5 != 0);
    if (iVar1 < (int)uVar7) {
      ppvVar3 = pVVar2->pArray;
      do {
        *(undefined8 *)ppvVar3[uVar9] = 0x4e6e6b284e6e6b28;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
  }
  return;
}

Assistant:

void Abc_ManTimeExpand( Abc_ManTime_t * p, int nSize, int fProgressive )
{
    Vec_Ptr_t * vTimes;
    Abc_Time_t * ppTimes, * ppTimesOld, * pTime;
    int nSizeOld, nSizeNew, i;

    nSizeOld = p->vArrs->nSize;
    if ( nSizeOld >= nSize )
        return;
    nSizeNew = fProgressive? 2 * nSize : nSize;
    if ( nSizeNew < 100 )
        nSizeNew = 100;

    vTimes = p->vArrs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = -ABC_INFINITY;
        pTime->Fall  = -ABC_INFINITY;
    }

    vTimes = p->vReqs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = ABC_INFINITY;
        pTime->Fall  = ABC_INFINITY;
    }
}